

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O1

int busy_loop_delay(int milliseconds)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  timeval tv;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var2 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  do {
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  } while ((ulong)((local_40.tv_sec - _Var1) * 1000000 + (local_40.tv_usec - _Var2)) / 1000 <=
           (ulong)(long)milliseconds);
  return 0;
}

Assistant:

int busy_loop_delay(int milliseconds)
{
	int cycles = 0, r = 0, first = 1;
	uint64_t a, b, c;
	sys_precise_clock(&a);
	while (1) {
		sys_precise_clock(&c);
		if ((c - a) / 1000 > milliseconds) return r;
		r += busy_loop(cycles);
		if (first) {
			first = 0;
		} else {
			if (c - b < 1000) cycles *= 2;
			if (c - b > 10000) cycles /= 2;
		}
		b = c;
	}
}